

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void write_vram(Emulator *e,MaskedAddress addr,u8 value)

{
  ppu_synchronize(e);
  if ((e->state).ppu.stat.mode != PPU_MODE_MODE3) {
    if (0x1fff < addr) {
      __assert_fail("addr <= ADDR_MASK_8K",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                    ,0x7df,"void write_vram(Emulator *, MaskedAddress, u8)");
    }
    (e->state).vram.data[(ulong)(e->state).vram.offset + (ulong)addr] = value;
  }
  return;
}

Assistant:

static void write_vram(Emulator* e, MaskedAddress addr, u8 value) {
  ppu_synchronize(e);
  if (UNLIKELY(is_using_vram(e, TRUE))) {
    HOOK(write_vram_in_use_ab, addr, value);
    return;
  }

  assert(addr <= ADDR_MASK_8K);
  VRAM.data[VRAM.offset + addr] = value;
}